

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

word Exp_Truth6(int nVars,Vec_Int_t *p,word *puFanins)

{
  int iVar1;
  word *puFanins_00;
  word *puNodes;
  word wVar2;
  word wVar3;
  long lVar4;
  long lVar5;
  
  puFanins_00 = Exp_Truth6::Truth6;
  if (puFanins != (word *)0x0) {
    puFanins_00 = puFanins;
  }
  iVar1 = p->nSize;
  puNodes = (word *)calloc((long)(iVar1 / 2),8);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < iVar1 / 2; lVar4 = lVar4 + 1) {
    iVar1 = Vec_IntEntry(p,(int)lVar5);
    wVar2 = Exp_Truth6Lit(nVars,iVar1,puFanins_00,puNodes);
    iVar1 = Vec_IntEntry(p,(int)lVar5 + 1);
    wVar3 = Exp_Truth6Lit(nVars,iVar1,puFanins_00,puNodes);
    *(word *)((long)puNodes + lVar5 * 4) = wVar3 & wVar2;
    iVar1 = p->nSize;
    lVar5 = lVar5 + 2;
  }
  iVar1 = Vec_IntEntryLast(p);
  wVar2 = Exp_Truth6Lit(nVars,iVar1,puFanins_00,puNodes);
  free(puNodes);
  return wVar2;
}

Assistant:

static inline word Exp_Truth6( int nVars, Vec_Int_t * p, word * puFanins )
{
    static word Truth6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    word * puNodes, Res;
    int i;
    if ( puFanins == NULL )
        puFanins = (word *)Truth6;
    puNodes = ABC_CALLOC( word, Exp_NodeNum(p) );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
        puNodes[i] = Exp_Truth6Lit( nVars, Vec_IntEntry(p, 2*i+0), puFanins, puNodes ) & 
                     Exp_Truth6Lit( nVars, Vec_IntEntry(p, 2*i+1), puFanins, puNodes );
    Res = Exp_Truth6Lit( nVars, Vec_IntEntryLast(p), puFanins, puNodes );
    ABC_FREE( puNodes );
    return Res;
}